

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O0

string * __thiscall
flatbuffers::(anonymous_namespace)::NimBfbsGenerator::GenerateType_abi_cxx11_
          (string *__return_storage_ptr__,void *this,BaseType base_type)

{
  char *__s;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  BaseType local_1c;
  void *pvStack_18;
  BaseType base_type_local;
  NimBfbsGenerator *this_local;
  
  local_1c = base_type;
  pvStack_18 = this;
  this_local = (NimBfbsGenerator *)__return_storage_ptr__;
  switch(base_type) {
  case None:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uint8",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
    break;
  case UType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uint8",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case Bool:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bool",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case Byte:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int8",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case UByte:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uint8",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case Short:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int16",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case UShort:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uint16",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case Int:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int32",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case UInt:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uint32",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case Long:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int64",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  case ULong:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uint64",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case Float:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"float32",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case Double:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"float64",&local_38);
    std::allocator<char>::~allocator(&local_38);
    break;
  case String:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"string",&local_39);
    std::allocator<char>::~allocator(&local_39);
    break;
  default:
    __s = reflection::EnumNameBaseType(base_type);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_3a);
    std::allocator<char>::~allocator(&local_3a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateType(const r::BaseType base_type) const {
    switch (base_type) {
      case r::None: return "uint8";
      case r::UType: return "uint8";
      case r::Bool: return "bool";
      case r::Byte: return "int8";
      case r::UByte: return "uint8";
      case r::Short: return "int16";
      case r::UShort: return "uint16";
      case r::Int: return "int32";
      case r::UInt: return "uint32";
      case r::Long: return "int64";
      case r::ULong: return "uint64";
      case r::Float: return "float32";
      case r::Double: return "float64";
      case r::String: return "string";
      default: return r::EnumNameBaseType(base_type);
    }
  }